

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendstate.c
# Opt level: O1

int quicly_sendstate_lost(quicly_sendstate_t *state,quicly_sendstate_sent_t *args)

{
  quicly_range_t *pqVar1;
  int iVar2;
  ulong uVar3;
  size_t sVar4;
  long lVar5;
  ulong uVar6;
  ulong start;
  
  uVar3 = args->end;
  if (args->start < uVar3) {
    lVar5 = 0x10;
    sVar4 = 0;
    uVar6 = args->start;
    do {
      pqVar1 = (state->acked).ranges;
      start = *(ulong *)((long)pqVar1 + lVar5 + -8);
      if (start < uVar6) {
        start = uVar6;
      }
      sVar4 = sVar4 + 1;
      if ((sVar4 == (state->acked).num_ranges) ||
         (uVar6 = *(ulong *)((long)&pqVar1->start + lVar5), uVar3 <= uVar6)) {
        if ((start < uVar3) && (iVar2 = quicly_ranges_add(&state->pending,start,uVar3), iVar2 != 0))
        {
          return iVar2;
        }
        break;
      }
      if ((start < uVar6) && (iVar2 = quicly_ranges_add(&state->pending,start,uVar6), iVar2 != 0)) {
        return iVar2;
      }
      lVar5 = lVar5 + 0x10;
      uVar6 = start;
    } while (start < uVar3);
  }
  sVar4 = (state->pending).num_ranges;
  if ((sVar4 != 0) && (((state->pending).ranges)->start < ((state->acked).ranges)->end)) {
    __assert_fail("state->pending.num_ranges == 0 || state->acked.ranges[0].end <= state->pending.ranges[0].start"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/sendstate.c"
                  ,0xac,"int quicly_sendstate_lost(quicly_sendstate_t *, quicly_sendstate_sent_t *)"
                 );
  }
  uVar3 = sVar4 + (state->acked).num_ranges;
  iVar2 = 0;
  if (0xff < uVar3) {
    iVar2 = 0xff07;
    if ((long)(uVar3 * 0x80) <= (long)(state->size_inflight - ((state->acked).ranges)->end)) {
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int quicly_sendstate_lost(quicly_sendstate_t *state, quicly_sendstate_sent_t *args)
{
    uint64_t start = args->start, end = args->end;
    size_t acked_slot = 0;
    int ret;

    while (start < end) {
        if (start < state->acked.ranges[acked_slot].end)
            start = state->acked.ranges[acked_slot].end;
        ++acked_slot;
        if (acked_slot == state->acked.num_ranges || end <= state->acked.ranges[acked_slot].start) {
            if (start < end) {
                if ((ret = quicly_ranges_add(&state->pending, start, end)) != 0)
                    return ret;
            }
            goto Exit;
        }
        if (start < state->acked.ranges[acked_slot].start) {
            if ((ret = quicly_ranges_add(&state->pending, start, state->acked.ranges[acked_slot].start)) != 0)
                return ret;
        }
    }

Exit:
    assert(state->pending.num_ranges == 0 || state->acked.ranges[0].end <= state->pending.ranges[0].start);
    return check_amount_of_state(state);
}